

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O2

void trim_contents(obj *container,int prob1,int prob2)

{
  int iVar1;
  obj *obj;
  
  while (obj = container, obj != (obj *)0x0) {
    container = obj->nobj;
    if (obj->cobj != (obj *)0x0) {
      trim_contents(obj->cobj,prob1,prob2);
    }
    iVar1 = rn2(prob2);
    if ((iVar1 < prob1) && ((obj != uskin || (0x15 < (ushort)(uskin->otyp - 0x54U))))) {
      obj_extract_self(obj);
      obfree(obj,(obj *)0x0);
    }
  }
  return;
}

Assistant:

static void trim_contents(struct obj *container, int prob1, int prob2)
{
	struct obj *otmp;
	struct obj *onext;

	for (otmp = container; otmp; otmp = onext) {
		onext = otmp->nobj;
		if (Has_contents(otmp))
			trim_contents(otmp->cobj, prob1, prob2);
		/* Don't remove dragon scales/mails when player is polymorphed into
		 * that dragon, otherwise if gold dragon armor gets removed, the
		 * associated light source won't be deleted and the game will crash. */
		if (rnf(prob1, prob2) &&
		    !(otmp == uskin && Is_dragon_armor(uskin->otyp))) {
			obj_extract_self(otmp);
			obfree(otmp, NULL);	/* dealloc_obj() isn't sufficient */
		}
	}
}